

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

curl_off_t Curl_mime_size(curl_mimepart *part)

{
  curl_off_t cVar1;
  size_t sVar2;
  size_t sVar3;
  long local_18;
  curl_off_t size;
  curl_mimepart *part_local;
  
  if (part->kind == MIMEKIND_MULTIPART) {
    cVar1 = multipart_size((curl_mime *)part->arg);
    part->datasize = cVar1;
  }
  local_18 = part->datasize;
  if (part->encoder != (mime_encoder *)0x0) {
    local_18 = (*part->encoder->sizefunc)(part);
  }
  if ((-1 < local_18) && ((part->flags & 2) == 0)) {
    sVar2 = slist_size(part->curlheaders,2,(char *)0x0);
    sVar3 = slist_size(part->userheaders,2,"Content-Type");
    local_18 = sVar3 + sVar2 + local_18 + 2;
  }
  return local_18;
}

Assistant:

curl_off_t Curl_mime_size(curl_mimepart *part)
{
  curl_off_t size;

  if(part->kind == MIMEKIND_MULTIPART)
    part->datasize = multipart_size(part->arg);

  size = part->datasize;

  if(part->encoder)
    size = part->encoder->sizefunc(part);

  if(size >= 0 && !(part->flags & MIME_BODY_ONLY)) {
    /* Compute total part size. */
    size += slist_size(part->curlheaders, 2, NULL);
    size += slist_size(part->userheaders, 2, "Content-Type");
    size += 2;    /* CRLF after headers. */
  }
  return size;
}